

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<signed_char,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_long lhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  char cVar1;
  bool bVar2;
  undefined1 *in_RDX;
  undefined1 in_SIL;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  unsigned_long *in_stack_ffffffffffffffb8;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  unsigned_long in_stack_ffffffffffffffd8;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_ffffffffffffffe6;
  undefined1 local_19;
  
  cVar1 = ::SafeInt::operator_cast_to_signed_char(in_stack_ffffffffffffffc0);
  if (cVar1 < '\x01') {
    cVar1 = ::SafeInt::operator_cast_to_signed_char(in_stack_ffffffffffffffc0);
    if (cVar1 == '\0') {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    bVar2 = DivisionNegativeCornerCaseHelper<signed_char,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::NegativeCornerCase
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe6,
                       (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0
                                                )));
    if (!bVar2) {
      ::SafeInt::operator_cast_to_signed_char(in_stack_ffffffffffffffc0);
      SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_long>(in_stack_ffffffffffffffc0,(unsigned_long *)in_RDI);
      *in_RDX = in_stack_ffffffffffffffd6;
    }
  }
  else {
    ::SafeInt::operator_cast_to_signed_char(in_RDI);
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
    SafeInt<unsigned_long>(in_RDI,in_stack_ffffffffffffffb8);
    *in_RDX = local_19;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }